

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileRemote.cpp
# Opt level: O0

void __thiscall
adios2::transport::FileRemote::Read(FileRemote *this,char *buffer,size_t size,size_t start)

{
  int *piVar1;
  pointer pRVar2;
  ulong in_RCX;
  long in_RDX;
  undefined8 in_RSI;
  FileRemote *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcc8;
  int in_stack_fffffffffffffcd4;
  string *in_stack_fffffffffffffcd8;
  string *in_stack_fffffffffffffce0;
  string *in_stack_fffffffffffffce8;
  string *in_stack_fffffffffffffcf0;
  string local_300 [32];
  string local_2e0 [32];
  string local_2c0 [32];
  string local_2a0 [32];
  string local_280 [32];
  string local_260 [32];
  string local_240 [32];
  string local_220 [39];
  allocator local_1f9;
  string local_1f8 [39];
  undefined1 local_1d1 [40];
  undefined1 local_1a9 [33];
  string local_188 [32];
  string local_168 [32];
  string local_148 [32];
  string local_128 [32];
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [39];
  allocator local_a1;
  string local_a0 [39];
  allocator local_79;
  string local_78 [55];
  allocator local_41;
  string local_40 [32];
  ulong local_20;
  long local_18;
  undefined8 local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  WaitForOpen(in_RDI);
  if (local_20 != 0xffffffffffffffff) {
    if (in_RDI->m_Size <= local_20) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_40,"Toolkit",&local_41);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_78,"transport::file::FileRemote",&local_79);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a0,"Read",&local_a1);
      std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffcc8);
      std::operator+((char *)in_stack_fffffffffffffc98,in_stack_fffffffffffffc90);
      std::operator+(in_stack_fffffffffffffc98,(char *)in_stack_fffffffffffffc90);
      std::operator+(in_stack_fffffffffffffc98,in_stack_fffffffffffffc90);
      std::operator+(in_stack_fffffffffffffc98,(char *)in_stack_fffffffffffffc90);
      std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffcc8);
      std::operator+(in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0);
      helper::Throw<std::ios_base::failure[abi:cxx11]>
                (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,in_stack_fffffffffffffce0,
                 in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd4);
      std::__cxx11::string::~string(local_c8);
      std::__cxx11::string::~string(local_188);
      std::__cxx11::string::~string(local_e8);
      std::__cxx11::string::~string(local_108);
      std::__cxx11::string::~string(local_128);
      std::__cxx11::string::~string(local_148);
      std::__cxx11::string::~string(local_168);
      std::__cxx11::string::~string(local_a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_a1);
      std::__cxx11::string::~string(local_78);
      std::allocator<char>::~allocator((allocator<char> *)&local_79);
      std::__cxx11::string::~string(local_40);
      std::allocator<char>::~allocator((allocator<char> *)&local_41);
    }
    in_RDI->m_SeekPos = local_20;
    piVar1 = __errno_location();
    *piVar1 = 0;
    piVar1 = __errno_location();
    in_RDI->m_Errno = *piVar1;
  }
  if (in_RDI->m_Size < in_RDI->m_SeekPos + local_18) {
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_1a9 + 1),"Toolkit",(allocator *)__lhs);
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_1d1 + 1),"transport::file::FileRemote",(allocator *)__rhs);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1f8,"Read",&local_1f9);
    std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffcc8);
    std::operator+((char *)__lhs,__rhs);
    std::operator+(__lhs,(char *)__rhs);
    std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffcc8);
    std::operator+(in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0);
    std::operator+(__lhs,(char *)__rhs);
    std::operator+(__lhs,__rhs);
    std::operator+(__lhs,(char *)__rhs);
    std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffcc8);
    std::operator+(in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0);
    helper::Throw<std::ios_base::failure[abi:cxx11]>
              (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,in_stack_fffffffffffffce0,
               in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd4);
    std::__cxx11::string::~string(local_220);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffcc0);
    std::__cxx11::string::~string(local_240);
    std::__cxx11::string::~string(local_260);
    std::__cxx11::string::~string(local_280);
    std::__cxx11::string::~string(local_2a0);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffce0);
    std::__cxx11::string::~string(local_2c0);
    std::__cxx11::string::~string(local_2e0);
    std::__cxx11::string::~string(local_300);
    std::__cxx11::string::~string(local_1f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
    std::__cxx11::string::~string((string *)(local_1d1 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_1d1);
    std::__cxx11::string::~string((string *)(local_1a9 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_1a9);
  }
  pRVar2 = std::unique_ptr<adios2::Remote,_std::default_delete<adios2::Remote>_>::operator->
                     ((unique_ptr<adios2::Remote,_std::default_delete<adios2::Remote>_> *)0xd86510);
  (*pRVar2->_vptr_Remote[7])(pRVar2,local_20,local_18,local_10);
  return;
}

Assistant:

void FileRemote::Read(char *buffer, size_t size, size_t start)
{
    WaitForOpen();

    if (start != MaxSizeT)
    {
        if (start >= m_Size)
        {
            helper::Throw<std::ios_base::failure>(
                "Toolkit", "transport::file::FileRemote", "Read",
                "couldn't move to start position " + std::to_string(start) +
                    " beyond the size of " + m_Name + " which is " + std::to_string(m_Size));
        }
        m_SeekPos = start;
        errno = 0;
        m_Errno = errno;
    }

    if (m_SeekPos + size > m_Size)
    {
        helper::Throw<std::ios_base::failure>("Toolkit", "transport::file::FileRemote", "Read",
                                              "can't read " + std::to_string(size) +
                                                  " bytes from position " +
                                                  std::to_string(m_SeekPos) + " from " + m_Name +
                                                  " whose size is " + std::to_string(m_Size));
    }

    m_Remote->Read(start, size, buffer);
    if (m_IsCached)
    {
    }
}